

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O2

CURLMcode curl_multi_socket_all(Curl_multi *multi,int *running_handles)

{
  CURLMcode CVar1;
  
  if ((multi->field_0x1b1 & 4) == 0) {
    CVar1 = multi_socket(multi,true,-1,0,running_handles);
    if (CVar1 < CURLM_BAD_HANDLE) {
      CVar1 = Curl_update_timer(multi);
      return CVar1;
    }
  }
  else {
    CVar1 = CURLM_RECURSIVE_API_CALL;
  }
  return CVar1;
}

Assistant:

CURLMcode curl_multi_socket_all(struct Curl_multi *multi, int *running_handles)
{
  CURLMcode result;
  if(multi->in_callback)
    return CURLM_RECURSIVE_API_CALL;
  result = multi_socket(multi, TRUE, CURL_SOCKET_BAD, 0, running_handles);
  if(CURLM_OK >= result)
    result = Curl_update_timer(multi);
  return result;
}